

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneI.cpp
# Opt level: O0

unsigned_short __thiscall
PermutazioneI::ricercaBinaria
          (PermutazioneI *this,unsigned_short *vOrdinato,unsigned_short lunghezza,
          unsigned_short valore)

{
  ushort uVar1;
  uint uVar2;
  ushort local_20;
  ushort local_1e;
  uint i;
  unsigned_short fine;
  unsigned_short inizio;
  unsigned_short valore_local;
  unsigned_short lunghezza_local;
  unsigned_short *vOrdinato_local;
  PermutazioneI *this_local;
  
  local_1e = 0;
  uVar1 = lunghezza;
  while (local_20 = uVar1, local_1e < local_20) {
    uVar2 = ((uint)local_1e + (uint)local_20) / 2;
    uVar1 = (ushort)uVar2;
    if (vOrdinato[uVar2] < valore) {
      local_1e = uVar1 + 1;
      uVar1 = local_20;
    }
  }
  return local_1e;
}

Assistant:

unsigned short PermutazioneI::ricercaBinaria(unsigned short* vOrdinato, unsigned short lunghezza, 
	unsigned short valore) {

	unsigned short inizio = 0, fine = lunghezza;
	unsigned int i;

	while (inizio < fine) {
		i = (inizio + fine) / 2;
		if (valore > vOrdinato[i])
			inizio = i + 1;
		else fine = i;
	}

	return inizio;
}